

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Service_Request_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Service_Request_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  KINT32 Value;
  KFLOAT32 KVar4;
  KString local_280;
  KString local_260;
  __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
  local_240;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Service_Request_PDU *local_18;
  Service_Request_PDU *this_local;
  
  local_18 = this;
  this_local = (Service_Request_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Service Request-\n");
  Logistics_Header::GetAsString_abi_cxx11_(&local_210,(Logistics_Header *)this);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\tService Type:           ");
  DATA_TYPE::ENUMS::GetEnumAsStringServiceTypeRequested_abi_cxx11_
            ((KString *)&citr,(ENUMS *)(ulong)this->m_ui8ServiceTypeRequested,Value);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"\tNumber Of Supply Types: ");
  std::ostream::operator<<(poVar2,(ushort)(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::
            begin(&(this->super_Resupply_Received_PDU).m_vSupplies);
  local_240._M_current =
       (Supplies *)
       std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::end
                 (&(this->super_Resupply_Received_PDU).m_vSupplies);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_240);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
             ::operator->(&citrEnd);
    (*(pSVar3->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[2])(&local_280);
    UTILS::IndentString(&local_260,&local_280,1,'\t');
    poVar2 = std::operator<<(local_190,(string *)&local_260);
    poVar2 = std::operator<<(poVar2,"\tQuantity :\t");
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
             ::operator->(&citrEnd);
    KVar4 = DATA_TYPE::Supplies::GetQuantity(pSVar3);
    std::ostream::operator<<(poVar2,(float)KVar4);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Service_Request_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Service Request-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tService Type:           " << GetEnumAsStringServiceTypeRequested( m_ui8ServiceTypeRequested )
       << "\tNumber Of Supply Types: " << ( KUINT16 )m_ui8NumSupplyTypes;

    // Now add supplies
    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 )
           << "\tQuantity :	" << citr->GetQuantity();
    }

    return ss.str();
}